

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnHeader
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,NLHeader *h)

{
  int nobj_header;
  int iVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *in_RSI;
  BasicProblem<mp::BasicProblemParams<int>_> *in_RDI;
  int n_objs;
  int n;
  NLHeader *in_stack_00000028;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_00000030;
  int in_stack_000000bc;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_000000c0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  BasicProblem<mp::BasicProblemParams<int>_>::SetInfo
            (in_RSI,(NLProblemInfo *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  AddVariables(in_stack_00000030,in_stack_00000028);
  nobj_header = NLProblemInfo::num_common_exprs((NLProblemInfo *)in_RSI);
  if (nobj_header != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs(in_stack_000000c0,in_stack_000000bc);
  }
  iVar1 = resulting_nobj((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)in_RSI
                         ,nobj_header);
  if (iVar1 != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddObjs(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)((long)&(in_RSI->super_ExprFactory)._vptr_BasicExprFactory + 4) != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddAlgebraicCons(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)((long)&(in_RSI->super_ExprFactory).exprs_.
                      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) != 0) {
    BasicProblem<mp::BasicProblemParams<int>_>::AddLogicalCons(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)((long)&(in_RSI->super_SuffixManager).suffixes_[0].set_._M_t._M_impl.
                      super__Rb_tree_header._M_header + 0x10) != 0) {
    BasicExprFactory<std::allocator<char>_>::AddFunctions(&in_RSI->super_ExprFactory,nobj_header);
  }
  return;
}

Assistant:

void OnHeader(const NLHeader &h) {
    builder_.SetInfo(h);

    // As nl-benchmark shows, adding problem components at once and then
    // updating them is faster than adding them incrementally. The latter
    // requires additional checks to make sure that problem components are
    // in the correct order.
    AddVariables(h);
    if (int n = h.num_common_exprs())
      builder_.AddCommonExprs(n);
    int n_objs = resulting_nobj( h.num_objs );
    if (n_objs != 0)
      builder_.AddObjs( n_objs );
    if (h.num_algebraic_cons != 0)
      builder_.AddAlgebraicCons(h.num_algebraic_cons);
    if (h.num_logical_cons != 0)
      builder_.AddLogicalCons(h.num_logical_cons);
    if (h.num_funcs != 0)
      builder_.AddFunctions(h.num_funcs);
  }